

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<short,long>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  long in_stack_ffffffffffffffa8;
  long local_50;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_42;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  long u;
  
  u = 0;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long>(&local_42,&u);
  su.m_int = u;
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<long>(&st2,&su);
  local_42.m_int = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,&u);
  SafeCastHelper<short,long,4>::
  CastThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
            (su.m_int,(short *)&local_42);
  local_42.m_int = st2.m_int;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
            (&local_42,st2);
  operator*(u,local_42);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,su);
  u = 1;
  local_50._0_4_ = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,(int *)&local_50);
  su.m_int = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  local_50._0_4_ = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&st2,(int *)&local_50);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            (&local_42,st2);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,su);
  u = 1;
  local_50._0_4_ = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&st2,(int *)&local_50);
  local_50._0_4_ = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,(int *)&local_50);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
            (&local_42,st2);
  operator/(u,local_42);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,su);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
            (&local_42,st2);
  operator+(u,local_42);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,su);
  local_50._0_4_ = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,(int *)&local_50);
  u = 0;
  local_50._0_4_ = 0;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&st2,(int *)&local_50);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
            (&local_42,st2);
  operator-(in_stack_ffffffffffffffa8,
            (SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
            0x0);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  local_50 = CONCAT44(local_50._4_4_,1);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,(int *)&local_50);
  su.m_int = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,
             (SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             0x1);
  u = 1;
  su.m_int = 1;
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,1);
  SVar1 = SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator<<((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_42,su);
  operator<<(SVar1.m_int,su);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,su);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SVar1 = SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
          operator>>((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                      *)&local_42,su);
  operator>>(SVar1.m_int,su);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,u);
  SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
            ((SafeInt<short,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *
             )&local_42,su);
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
            (&local_42,st2);
  local_50 = BinaryAndHelper<long,_short,_2>::And(su.m_int,local_42.m_int & (ushort)u);
  SafeInt::operator_cast_to_short((SafeInt *)&local_50);
  local_42.m_int = (ushort)su.m_int & (ushort)u & local_42.m_int & st2.m_int;
  local_50 = BinaryOrHelper<long,_short,_2>::Or(su.m_int,(ushort)u);
  SafeInt::operator_cast_to_short((SafeInt *)&local_50);
  local_42.m_int = (ushort)su.m_int | (ushort)u | local_42.m_int | st2.m_int;
  local_50 = BinaryXorHelper<long,_short,_2>::Xor(su.m_int,local_42.m_int ^ (ushort)u);
  SafeInt::operator_cast_to_short((SafeInt *)&local_50);
  return;
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}